

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecFlt.h
# Opt level: O2

int Vec_FltEqual(Vec_Flt_t *p1,Vec_Flt_t *p2)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = p1->nSize;
  if (uVar3 == p2->nSize) {
    uVar5 = 0;
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar4 = uVar5;
    }
    do {
      if (uVar4 == uVar5) {
        return 1;
      }
      pfVar1 = p1->pArray + uVar5;
      pfVar2 = p2->pArray + uVar5;
      uVar5 = uVar5 + 1;
    } while ((*pfVar1 == *pfVar2) && (!NAN(*pfVar1) && !NAN(*pfVar2)));
  }
  return 0;
}

Assistant:

static inline int Vec_FltEqual( Vec_Flt_t * p1, Vec_Flt_t * p2 ) 
{
    int i;
    if ( p1->nSize != p2->nSize )
        return 0;
    for ( i = 0; i < p1->nSize; i++ )
        if ( p1->pArray[i] != p2->pArray[i] )
            return 0;
    return 1;
}